

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_Return_Button_Type::ideal_size(Fl_Return_Button_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  
  Fl_Button_Type::ideal_size(&this->super_Fl_Button_Type,w,h);
  pFVar1 = (this->super_Fl_Button_Type).super_Fl_Widget_Type.o;
  iVar2 = pFVar1->w_ / 3;
  iVar3 = pFVar1->h_;
  if (iVar2 < pFVar1->h_) {
    iVar3 = iVar2;
  }
  *w = *w + (iVar3 - (pFVar1->label_).size) + 8;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Button_Type::ideal_size(w, h);
    int W = o->h();
    if (o->w()/3 < W) W = o->w()/3;
    w += W + 8 - o->labelsize();
  }